

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

void dosinkring(obj *obj)

{
  undefined1 *puVar1;
  char cVar2;
  obj *poVar3;
  bool bVar4;
  obj *obj_00;
  boolean bVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  
  cVar2 = obj->where;
  pcVar7 = doname(obj);
  if (cVar2 == '\x03') {
    pcVar7 = "You drop %s down the drain.";
  }
  else {
    upstart(pcVar7);
    pcVar7 = "%s falls down the drain.";
  }
  pline(pcVar7);
  obj->field_0x4c = obj->field_0x4c | 0x80;
  bVar4 = false;
  switch(obj->otyp) {
  case 0x9e:
    goto code_r0x0016ea1a;
  case 0x9f:
    goto code_r0x0016ea1a;
  case 0xa0:
    pcVar7 = "The water seems %ser now.";
    break;
  case 0xa1:
    goto code_r0x0016ea1a;
  case 0xa2:
code_r0x0016ea1a:
    pcVar7 = "The water flow seems %ser now.";
    break;
  case 0xa3:
    pcVar7 = "The water flow %s the drain.";
    break;
  case 0xa4:
    pcVar7 = "The water\'s force seems %ser now.";
    break;
  case 0xa5:
  case 0xa6:
  case 0xa8:
  case 0xae:
  case 0xb0:
  case 0xb1:
  case 0xb3:
    goto switchD_0016e91b_caseD_a5;
  case 0xa7:
    pcVar7 = xname(obj);
    pline("You thought your %s got lost in the sink, but there it is!",pcVar7);
    goto LAB_0016ecd3;
  case 0xa9:
    pcVar7 = "The water flow seems fixed.";
    goto LAB_0016ec20;
  case 0xaa:
    pcVar7 = "The sink quivers upward for a moment.";
    goto LAB_0016ec20;
  case 0xab:
    bVar4 = false;
    poVar3 = level->objects[u.ux][u.uy];
    while (obj_00 = poVar3, obj_00 != (obj *)0x0) {
      poVar3 = (obj_00->v).v_nexthere;
      if (((obj_00 != uball) && (obj_00 != uchain)) &&
         (bVar5 = obj_resists(obj_00,1,99), bVar5 == '\0')) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016eaf8;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016eaf3;
LAB_0016eb1e:
          pcVar7 = doname(obj_00);
          pcVar8 = otense(obj_00,"vanish");
          pline("Suddenly, %s %s from the sink!",pcVar7,pcVar8);
          bVar4 = true;
        }
        else {
LAB_0016eaf3:
          if (ublindf != (obj *)0x0) {
LAB_0016eaf8:
            if (ublindf->oartifact == '\x1d') goto LAB_0016eb1e;
          }
        }
        delobj(obj_00);
      }
    }
    goto switchD_0016e91b_caseD_a5;
  case 0xac:
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
      pcVar7 = rndmonnam();
      makeplural(pcVar7);
    }
    pcVar7 = "Several %s buzz angrily around the sink.";
    break;
  case 0xad:
    You_hear("loud noises coming from the drain.");
    goto LAB_0016ec27;
  case 0xaf:
    pcVar7 = fruitname('\0');
    makeplural(pcVar7);
    pcVar7 = "You smell rotten %s.";
    break;
  case 0xb2:
    pcVar7 = "Static electricity surrounds the sink.";
LAB_0016ec20:
    pline(pcVar7);
    goto LAB_0016ec27;
  case 0xb4:
    pline("The ring is regurgitated!");
LAB_0016ecd3:
    obj->field_0x4c = obj->field_0x4c & 0x7f;
    dropx(obj);
    discover_object((int)obj->otyp,'\x01','\x01');
    return;
  default:
    if (obj->otyp == 0x113) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
        pcVar7 = rndmonnam();
        makeplural(pcVar7);
      }
      pcVar7 = "Several %s buzz around the sink.";
      break;
    }
    goto switchD_0016e91b_caseD_a5;
  }
  pline(pcVar7);
LAB_0016ec27:
  bVar4 = true;
switchD_0016e91b_caseD_a5:
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016ec4a;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016ec45;
    if (!bVar4) goto LAB_0016ec97;
    goto switchD_0016ecb7_caseD_9e;
  }
LAB_0016ec45:
  if (ublindf == (obj *)0x0) {
LAB_0016ec54:
    if (!bVar4) {
switchD_0016ecb7_caseD_ab:
      You_hear("the ring bouncing down the drainpipe.");
      goto LAB_0016ee6b;
    }
    goto switchD_0016ecb7_caseD_9e;
  }
LAB_0016ec4a:
  if (ublindf->oartifact != '\x1d' || bVar4) goto LAB_0016ec54;
LAB_0016ec97:
  switch(obj->otyp) {
  case 0x9d:
    pcVar7 = "The faucets flash brightly for a moment.";
    break;
  default:
    goto switchD_0016ecb7_caseD_9e;
  case 0xa5:
    pcVar7 = "silver";
    if (obj->spe < '\0') {
      pcVar7 = "black";
    }
    goto LAB_0016ed86;
  case 0xa6:
    pcVar7 = "The sink looks as good as new.";
    break;
  case 0xa8:
    pcVar7 = "The sink seems to blend into the floor for a moment.";
    break;
  case 0xab:
    goto switchD_0016ecb7_caseD_ab;
  case 0xae:
    pcVar7 = "red";
LAB_0016ed86:
    pcVar7 = hcolor(pcVar7);
    pcVar8 = "The sink glows %s for a moment.";
LAB_0016ee51:
    pline(pcVar8,pcVar7);
    goto switchD_0016ecb7_caseD_9e;
  case 0xb0:
    pcVar7 = "The hot water faucet flashes brightly for a moment.";
    break;
  case 0xb1:
    pcVar7 = "The cold water faucet flashes brightly for a moment.";
    break;
  case 0xb3:
    pcVar7 = "You see the ring slide right down the drain!";
    break;
  case 0xb5:
    bVar5 = teleport_sink();
    if (bVar5 == '\0') {
      pcVar7 = "The sink momentarily vanishes.";
    }
    else {
      pcVar7 = "The sink vanishes!";
    }
    break;
  case 0xb6:
    pcVar7 = "The sink looks like it is being beamed aboard somewhere.";
    break;
  case 0xb7:
    polymorph_sink();
    goto switchD_0016ecb7_caseD_9e;
  case 0xb8:
    pline("The sink transforms into another sink!");
    puVar1 = &level->locations[u.ux][u.uy].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
    goto switchD_0016ecb7_caseD_9e;
  case 0xb9:
    pcVar7 = "The water flow momentarily vanishes.";
    break;
  case 0xba:
    pcVar7 = "air";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar7 = "oxygen molecules";
      }
      else {
        bVar5 = dmgtype(youmonst.data,0x24);
        pcVar7 = "air";
        if (bVar5 == '\0') {
          pcVar7 = "oxygen molecules";
        }
      }
    }
    pcVar8 = "You see some %s in the sink.";
    goto LAB_0016ee51;
  case 0xbb:
    pcVar7 = "The sink looks nothing like a fountain.";
  }
  pline(pcVar7);
switchD_0016ecb7_caseD_9e:
  discover_object((int)obj->otyp,'\x01','\x01');
LAB_0016ee6b:
  uVar6 = mt_random();
  if ((uVar6 * -0x33333333 >> 2 | uVar6 * 0x40000000) < 0xccccccd) {
    pcVar7 = doname(obj);
    pline("The sink backs up, leaving %s.",pcVar7);
    obj->field_0x4c = obj->field_0x4c & 0x7f;
    dropx(obj);
    return;
  }
  if (cVar2 != '\x03') {
    obfree(obj,(obj *)0x0);
    return;
  }
  useup(obj);
  return;
}

Assistant:

static void dosinkring(struct obj *obj)  /* obj is a ring being dropped over a kitchen sink */
{
	struct obj *otmp,*otmp2;
	boolean ideed = TRUE;
	boolean ring_in_inv = carried(obj);

	if (ring_in_inv)
	    pline("You drop %s down the drain.", doname(obj));
	else
	    pline("%s falls down the drain.", upstart(doname(obj)));

	obj->in_use = TRUE;	/* block free identification via interrupt */
	switch(obj->otyp) {	/* effects that can be noticed without eyes */
	    case RIN_SEARCHING:
		pline("You thought your %s got lost in the sink, but there it is!",
			xname(obj));
		goto giveback;
	    case RIN_SLOW_DIGESTION:
		pline("The ring is regurgitated!");
giveback:
		obj->in_use = FALSE;
		dropx(obj);
		makeknown(obj->otyp);
		return;
	    case RIN_LEVITATION:
		pline("The sink quivers upward for a moment.");
		break;
	    case RIN_POISON_RESISTANCE:
		pline("You smell rotten %s.", makeplural(fruitname(FALSE)));
		break;
	    case RIN_AGGRAVATE_MONSTER:
		pline("Several %s buzz angrily around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    case RIN_SHOCK_RESISTANCE:
		pline("Static electricity surrounds the sink.");
		break;
	    case RIN_CONFLICT:
		You_hear("loud noises coming from the drain.");
		break;
	    case RIN_SUSTAIN_ABILITY:	/* KMH */
		pline("The water flow seems fixed.");
		break;
	    case RIN_GAIN_STRENGTH:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "weak" : "strong");
		break;
	    case RIN_GAIN_CONSTITUTION:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "less" : "great");
		break;
	    case RIN_GAIN_INTELLIGENCE:
		pline("The water seems %ser now.",
			(obj->spe<0) ? "dimm" : "bright");
		break;
	    case RIN_GAIN_WISDOM:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "dull" : "quick");
		break;
	    case RIN_GAIN_DEXTERITY:
		pline("The water flow seems %ser now.",
			(obj->spe<0) ? "slow" : "fast");
		break;
	    case RIN_INCREASE_ACCURACY:	/* KMH */
		pline("The water flow %s the drain.",
			(obj->spe<0) ? "misses" : "hits");
		break;
	    case RIN_INCREASE_DAMAGE:
		pline("The water's force seems %ser now.",
			(obj->spe<0) ? "small" : "great");
		break;
	    case RIN_HUNGER:
		ideed = FALSE;
		for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp2) {
		    otmp2 = otmp->nexthere;
		    if (otmp != uball && otmp != uchain &&
			    !obj_resists(otmp, 1, 99)) {
			if (!Blind) {
			    pline("Suddenly, %s %s from the sink!",
				  doname(otmp), otense(otmp, "vanish"));
			    ideed = TRUE;
			}
			delobj(otmp);
		    }
		}
		break;
	    case MEAT_RING:
		/* Not the same as aggravate monster; besides, it's obvious. */
		pline("Several %s buzz around the sink.",
		      Hallucination ? makeplural(rndmonnam()) : "flies");
		break;
	    default:
		ideed = FALSE;
		break;
	}
	if (!Blind && !ideed && obj->otyp != RIN_HUNGER) {
	    ideed = TRUE;
	    switch(obj->otyp) {		/* effects that need eyes */
		case RIN_ADORNMENT:
		    pline("The faucets flash brightly for a moment.");
		    break;
		case RIN_REGENERATION:
		    pline("The sink looks as good as new.");
		    break;
		case RIN_INVISIBILITY:
		    pline("The water flow momentarily vanishes.");
		    break;
		case RIN_FREE_ACTION:
		    pline("You see the ring slide right down the drain!");
		    break;
		case RIN_SEE_INVISIBLE:
		    pline("You see some %s in the sink.",
			  Hallucination ? "oxygen molecules" : "air");
		    break;
		case RIN_STEALTH:
		pline("The sink seems to blend into the floor for a moment.");
		    break;
		case RIN_FIRE_RESISTANCE:
		pline("The hot water faucet flashes brightly for a moment.");
		    break;
		case RIN_COLD_RESISTANCE:
		pline("The cold water faucet flashes brightly for a moment.");
		    break;
		case RIN_PROTECTION_FROM_SHAPE_CHANGERS:
		    pline("The sink looks nothing like a fountain.");
		    break;
		case RIN_PROTECTION:
		    pline("The sink glows %s for a moment.",
			    hcolor((obj->spe<0) ? "black" : "silver"));
		    break;
		case RIN_WARNING:
		    pline("The sink glows %s for a moment.", hcolor("red"));
		    break;
		case RIN_TELEPORTATION:
		    if (teleport_sink())
			pline("The sink vanishes!");
		    else
			pline("The sink momentarily vanishes.");
		    break;
		case RIN_TELEPORT_CONTROL:
	    pline("The sink looks like it is being beamed aboard somewhere.");
		    break;
		case RIN_POLYMORPH:
		    polymorph_sink();
		    break;
		case RIN_POLYMORPH_CONTROL:
		    pline("The sink transforms into another sink!");
		    level->locations[u.ux][u.uy].looted = 0;
		    break;
	    }
	}
	if (ideed)
	    makeknown(obj->otyp);
	else
	    You_hear("the ring bouncing down the drainpipe.");
	if (!rn2(20)) {
		pline("The sink backs up, leaving %s.", doname(obj));
		obj->in_use = FALSE;
		dropx(obj);
	} else {
	    if (ring_in_inv)
		useup(obj);
	    else
		obfree(obj, NULL);
	}
}